

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::XGLImporter::CanRead(XGLImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string extension;
  char *tokens [3];
  
  BaseImporter::GetExtension(&extension,pFile);
  bVar1 = std::operator==(&extension,"xgl");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&extension,"zgl");
    if (!bVar1) {
      bVar1 = std::operator==(&extension,"xml");
      if (bVar1 || checkSig) {
        if (pIOHandler == (IOSystem *)0x0) {
          __assert_fail("pIOHandler != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/XGL/XGLLoader.cpp"
                        ,0x7e,
                        "virtual bool Assimp::XGLImporter::CanRead(const std::string &, IOSystem *, bool) const"
                       );
        }
        tokens[2] = "<WORLD>";
        tokens[0] = "<world>";
        tokens[1] = "<World>";
        bVar2 = BaseImporter::SearchFileHeaderForToken(pIOHandler,pFile,tokens,3,200,false,false);
      }
      else {
        bVar2 = false;
      }
    }
  }
  std::__cxx11::string::~string((string *)&extension);
  return bVar2;
}

Assistant:

bool XGLImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    /* NOTE: A simple check for the file extension is not enough
     * here. XGL and ZGL are ok, but xml is too generic
     * and might be collada as well. So open the file and
     * look for typical signal tokens.
     */
    const std::string extension = GetExtension(pFile);

    if (extension == "xgl" || extension == "zgl") {
        return true;
    }
    else if (extension == "xml" || checkSig) {
        ai_assert(pIOHandler != NULL);

        const char* tokens[] = {"<world>","<World>","<WORLD>"};
        return SearchFileHeaderForToken(pIOHandler,pFile,tokens,3);
    }
    return false;
}